

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void AddCommandString(char *cmd,int keynum)

{
  char cVar1;
  long lVar2;
  DWaitingCommand *this;
  char cVar3;
  char *pcVar4;
  char *cmd_00;
  int tics;
  bool bVar6;
  char *pcVar5;
  
  if (cmd == (char *)0x0) {
    return;
  }
  cVar3 = *cmd;
joined_r0x004a9f15:
  cmd_00 = cmd;
  if (cVar3 == '\0') {
    return;
  }
  do {
    pcVar5 = cmd_00;
    if (cVar3 == '\"') {
      do {
        while( true ) {
          cmd_00 = pcVar5 + 1;
          cVar3 = *cmd_00;
          if (cVar3 == '\"') break;
          pcVar5 = cmd_00;
          if (cVar3 == '\0') goto LAB_004a9f4e;
        }
        cVar1 = *pcVar5;
        pcVar5 = cmd_00;
      } while (cVar1 == '\\');
    }
    else if ((cVar3 == '\0') || (cVar3 == ';')) break;
LAB_004a9f4e:
    bVar6 = cVar3 != '\0';
    cVar3 = cmd_00[bVar6];
    cmd_00 = cmd_00 + bVar6;
  } while( true );
  bVar6 = cVar3 == ';';
  if (bVar6) {
    *cmd_00 = '\0';
  }
  pcVar5 = cmd + 4;
  do {
    pcVar4 = pcVar5;
    cVar1 = pcVar4[-4];
    if (cVar1 == '\0') break;
    pcVar5 = pcVar4 + 1;
  } while (cVar1 < '!');
  if (cVar1 != '\0') {
    if ((((cVar1 == 'w') && (ParsingKeyConf == false)) && (pcVar4[-3] == 'a')) &&
       ((pcVar4[-2] == 'i' && (pcVar4[-1] == 't')))) {
      if (*pcVar4 == ' ') {
        lVar2 = strtol(pcVar4 + 1,(char **)0x0,0);
        tics = (int)lVar2;
        if (tics < 1) goto LAB_004a9fbd;
LAB_004a9ff3:
        if (cVar3 != ';') {
          return;
        }
        *cmd_00 = ';';
        this = (DWaitingCommand *)
               M_Malloc_Dbg(0x48,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                            ,0x1f7);
        DWaitingCommand::DWaitingCommand(this,cmd_00,tics);
        return;
      }
      if (*pcVar4 == '\0') {
        tics = 1;
        goto LAB_004a9ff3;
      }
    }
    C_DoCommand(pcVar4 + -4,keynum);
  }
LAB_004a9fbd:
  if (cVar3 == ';') {
    *cmd_00 = ';';
  }
  cmd = cmd_00 + bVar6;
  cVar3 = cmd_00[bVar6];
  goto joined_r0x004a9f15;
}

Assistant:

void AddCommandString (char *cmd, int keynum)
{
	char *brkpt;
	int more;

	if (cmd)
	{
		while (*cmd)
		{
			brkpt = cmd;
			while (*brkpt != ';' && *brkpt != '\0')
			{
				if (*brkpt == '\"')
				{
					brkpt++;
					while (*brkpt != '\0' && (*brkpt != '\"' || *(brkpt-1) == '\\'))
						brkpt++;
				}
				if (*brkpt != '\0')
					brkpt++;
			}
			if (*brkpt == ';')
			{
				*brkpt = '\0';
				more = 1;
			}
			else
			{
				more = 0;
			}
			// Intercept wait commands here. Note: wait must be lowercase
			while (*cmd && *cmd <= ' ')
				cmd++;
			if (*cmd)
			{
				if (!ParsingKeyConf &&
					cmd[0] == 'w' && cmd[1] == 'a' && cmd[2] == 'i' && cmd[3] == 't' &&
					(cmd[4] == 0 || cmd[4] == ' '))
				{
					int tics;

					if (cmd[4] == ' ')
					{
						tics = strtol (cmd + 5, NULL, 0);
					}
					else
					{
						tics = 1;
					}
					if (tics > 0)
					{
						if (more)
						{ // The remainder of the command will be executed later
						  // Note that deferred commands lose track of which key
						  // (if any) they were pressed from.
							*brkpt = ';';
							new DWaitingCommand (brkpt, tics);
						}
						return;
					}
				}
				else
				{
					C_DoCommand (cmd, keynum);
				}
			}
			if (more)
			{
				*brkpt = ';';
			}
			cmd = brkpt + more;
		}
	}
}